

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O1

int Abc_NtkPartitionSmartFindPart
              (Vec_Ptr_t *vPartSuppsAll,Vec_Ptr_t *vPartsAll,Vec_Ptr_t *vPartSuppsChar,
              int nSuppSizeLimit,Vec_Int_t *vOne)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  
  if ((long)vPartSuppsAll->nSize < 1) {
    iVar11 = -1;
  }
  else {
    uVar6 = 0;
    uVar8 = (ulong)(uint)vPartSuppsChar->nSize;
    if (vPartSuppsChar->nSize < 1) {
      uVar8 = uVar6;
    }
    uVar7 = 0xffffffff;
    iVar10 = 0;
    do {
      if (uVar6 == uVar8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar11 = vOne->nSize;
      if ((long)iVar11 < 1) {
        iVar4 = 0;
      }
      else {
        lVar9 = 0;
        iVar4 = 0;
        do {
          iVar4 = iVar4 + (uint)((*(uint *)((long)vPartSuppsChar->pArray[uVar6] +
                                           (long)(vOne->pArray[lVar9] >> 5) * 4) >>
                                  (vOne->pArray[lVar9] & 0x1fU) & 1) != 0);
          lVar9 = lVar9 + 1;
        } while (iVar11 != lVar9);
      }
      if (iVar4 != 0) {
        if (iVar4 == iVar11) {
          return (int)uVar6;
        }
        if ((nSuppSizeLimit < 1) ||
           (*(int *)((long)vPartSuppsAll->pArray[uVar6] + 4) < nSuppSizeLimit * 2)) {
          uVar3 = (long)(iVar4 * 1000) / (long)iVar11;
          iVar11 = *(int *)((long)vPartSuppsAll->pArray[uVar6] + 4);
          iVar4 = 1;
          if (99 < iVar11) {
            uVar5 = iVar11 - 100;
            if (1 < uVar5) {
              uVar5 = iVar11 - 0x65;
              if (uVar5 == 0) {
                uVar5 = 0;
              }
              else {
                uVar2 = 0x1f;
                if (uVar5 != 0) {
                  for (; uVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
                  }
                }
                uVar5 = (uVar2 ^ 0xffffffe0) + 0x21;
              }
            }
            iVar4 = uVar5 + 1;
          }
          iVar4 = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                       (long)iVar4);
          iVar11 = iVar10;
          if (iVar10 <= iVar4) {
            iVar11 = iVar4;
          }
          bVar1 = iVar10 < iVar4;
          iVar10 = iVar11;
          if (bVar1) {
            uVar7 = uVar6 & 0xffffffff;
          }
        }
      }
      iVar11 = (int)uVar7;
      uVar6 = uVar6 + 1;
    } while (uVar6 != (long)vPartSuppsAll->nSize);
    if (iVar10 < 0x4b) {
      iVar11 = -1;
    }
  }
  return iVar11;
}

Assistant:

int Abc_NtkPartitionSmartFindPart( Vec_Ptr_t * vPartSuppsAll, Vec_Ptr_t * vPartsAll, Vec_Ptr_t * vPartSuppsChar, int nSuppSizeLimit, Vec_Int_t * vOne )
{
/*
    Vec_Int_t * vPartSupp, * vPart;
    double Attract, Repulse, Cost, CostBest;
    int i, nCommon, iBest;
    iBest = -1;
    CostBest = 0.0;
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vPartSupp, i )
    {
        vPart = Vec_PtrEntry( vPartsAll, i );
        if ( nPartSizeLimit > 0 && Vec_IntSize(vPart) >= nPartSizeLimit )
            continue;
        nCommon = Vec_IntTwoCountCommon( vPartSupp, vOne );
        if ( nCommon == 0 )
            continue;
        if ( nCommon == Vec_IntSize(vOne) )
            return i;
        Attract = 1.0 * nCommon / Vec_IntSize(vOne);
        if ( Vec_IntSize(vPartSupp) < 100 )
            Repulse = 1.0;
        else
            Repulse = log10( Vec_IntSize(vPartSupp) / 10.0 );
        Cost = pow( Attract, pow(Repulse, 5.0) );
        if ( CostBest < Cost )
        {
            CostBest = Cost;
            iBest = i;
        }
    }
    if ( CostBest < 0.6 )
        return -1;
    return iBest;
*/

    Vec_Int_t * vPartSupp;//, * vPart;
    int Attract, Repulse, Value, ValueBest;
    int i, nCommon, iBest;
//    int nCommon2;
    iBest = -1;
    ValueBest = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vPartSupp, i )
    {
        // skip partitions with too many outputs
//        vPart = Vec_PtrEntry( vPartsAll, i );
//        if ( nSuppSizeLimit > 0 && Vec_IntSize(vPart) >= nSuppSizeLimit )
//            continue;
        // find the number of common variables between this output and the partitions
//        nCommon2 = Vec_IntTwoCountCommon( vPartSupp, vOne );
        nCommon = Abc_NtkSuppCharCommon( (unsigned *)Vec_PtrEntry(vPartSuppsChar, i), vOne );
//        assert( nCommon2 == nCommon );
        // if no common variables, continue searching
        if ( nCommon == 0 )
            continue;
        // if all variables are common, the best partition if found
        if ( nCommon == Vec_IntSize(vOne) )
            return i;
        // skip partitions whose size exceeds the limit
        if ( nSuppSizeLimit > 0 && Vec_IntSize(vPartSupp) >= 2 * nSuppSizeLimit )
            continue;
        // figure out might be the good partition for this one
        Attract = 1000 * nCommon / Vec_IntSize(vOne);
        if ( Vec_IntSize(vPartSupp) < 100 )
            Repulse = 1;
        else
            Repulse = 1+Abc_Base2Log(Vec_IntSize(vPartSupp)-100);
        Value = Attract/Repulse;
        if ( ValueBest < Value )
        {
            ValueBest = Value;
            iBest = i;
        }
    }
    if ( ValueBest < 75 )
        return -1;
    return iBest;
}